

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestCompressionF<Counter<unsigned_short,10u>,Counter<unsigned_char,4u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  ushort uVar10;
  uint uVar11;
  uint recent;
  uint uVar12;
  bool bVar13;
  
  iVar7 = 0;
  bVar8 = 0;
  bVar13 = false;
  uVar6 = 0;
  do {
    bVar4 = (bVar8 & 0xf) * '\x02';
    uVar3 = (ushort)uVar6;
    uVar1 = uVar3 & 0xf;
    uVar12 = 0;
    uVar11 = uVar6;
    do {
      if (uVar12 < uVar6) {
        iVar9 = 7;
        if ((int)uVar11 < 8 - bias) {
LAB_001021a7:
          uVar2 = (ushort)uVar12;
          uVar10 = uVar2 & 0x10 | uVar1;
          uVar5 = uVar2 & 0xf;
          if (uVar5 < uVar1) {
            if ((ushort)(8 - bias) <= (ushort)(uVar1 - uVar5)) {
              uVar10 = uVar10 + 0x3f0 & 0x3ff;
            }
          }
          else if ((ushort)(bias + 8) < (ushort)(uVar5 - uVar1)) {
            uVar10 = uVar10 + 0x10;
          }
          iVar9 = 1;
          if ((uVar10 == uVar3) &&
             ((bias != 0 ||
              ((((ushort)uVar11 & 0xf) + (bVar4 >> 4 & 1) * -0x10 + uVar2 & 0x3ff) == uVar3)))) {
            iVar9 = 0;
          }
        }
      }
      else {
        if ((int)(iVar7 + uVar12) <= bias + 8) goto LAB_001021a7;
        iVar9 = 7;
      }
      if ((iVar9 != 7) && (iVar9 != 0)) goto LAB_00102256;
      uVar12 = uVar12 + 1;
      uVar11 = uVar11 - 1;
      bVar4 = bVar4 - 2;
    } while (uVar12 != 0x20);
    iVar9 = 5;
LAB_00102256:
    if ((iVar9 != 5) && (iVar9 != 0)) {
      return bVar13;
    }
    bVar13 = 0x1e < uVar6;
    uVar6 = uVar6 + 1;
    bVar8 = bVar8 + 1;
    iVar7 = iVar7 + -1;
    if (uVar6 == 0x20) {
      return bVar13;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}